

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void set_txfm_context(MACROBLOCKD *xd,TX_SIZE tx_size,int blk_row,int blk_col)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  TXFM_CONTEXT *__s;
  
  pMVar4 = *xd->mi;
  BVar1 = pMVar4->bsize;
  uVar10 = (uint)block_size_high[BVar1];
  if (xd->mb_to_bottom_edge < 0) {
    uVar10 = (uint)block_size_high[BVar1] +
             (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar8 = (uint)block_size_wide[BVar1];
  if (xd->mb_to_right_edge < 0) {
    uVar8 = (uint)block_size_wide[BVar1] +
            (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f));
  }
  iVar11 = ((int)uVar10 >> 2) - blk_row;
  if ((iVar11 != 0 && blk_row <= (int)uVar10 >> 2) &&
     (iVar9 = ((int)uVar8 >> 2) - blk_col, iVar9 != 0 && blk_col <= (int)uVar8 >> 2)) {
    iVar6 = (blk_col >> (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
            ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
            (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f));
    if (pMVar4->inter_tx_size[iVar6] == tx_size) {
      pMVar4->tx_size = tx_size;
      __s = xd->above_txfm_context + blk_col;
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [txsize_to_bsize[tx_size]];
      iVar11 = tx_size_wide[tx_size];
      memset(xd->left_txfm_context + blk_row,tx_size_high[tx_size],
             (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [txsize_to_bsize[tx_size]] +
                     (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [txsize_to_bsize[tx_size]] == 0) & 0xff));
      uVar10 = (uint)bVar2 + (uint)(bVar2 == 0);
    }
    else {
      if (tx_size != '\x01') {
        iVar6 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
        if (iVar6 < iVar11) {
          iVar11 = iVar6;
        }
        iVar6 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
        if (iVar6 < iVar9) {
          iVar9 = iVar6;
        }
        if (iVar11 < 1) {
          return;
        }
        bVar2 = ""[tx_size];
        iVar6 = tx_size_wide_unit[bVar2];
        iVar3 = tx_size_high_unit[bVar2];
        iVar5 = 0;
        do {
          if (0 < iVar9) {
            iVar7 = 0;
            do {
              set_txfm_context(xd,bVar2,blk_row + iVar5,blk_col + iVar7);
              iVar7 = iVar7 + iVar6;
            } while (iVar7 < iVar9);
          }
          iVar5 = iVar5 + iVar3;
        } while (iVar5 < iVar11);
        return;
      }
      pMVar4->inter_tx_size[iVar6] = '\0';
      pMVar4->tx_size = '\0';
      __s = xd->above_txfm_context + blk_col;
      memset(xd->left_txfm_context + blk_row,4,2);
      uVar10 = 2;
      iVar11 = 4;
    }
    memset(__s,iVar11,(ulong)(uVar10 & 0xff));
    return;
  }
  return;
}

Assistant:

static void set_txfm_context(MACROBLOCKD *xd, TX_SIZE tx_size, int blk_row,
                             int blk_col) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (tx_size == plane_tx_size) {
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);

  } else {
    if (tx_size == TX_8X8) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;
        set_txfm_context(xd, sub_txs, offsetr, offsetc);
      }
    }
  }
}